

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_baryonyx::none_observer>
::store_if_better(solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_baryonyx::none_observer>
                  *this,bit_array *x,int remaining,long i)

{
  double dVar1;
  long i_local;
  int remaining_local;
  bit_array *x_local;
  solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_baryonyx::none_observer>
  *this_local;
  
  if (remaining < (this->m_best).remaining_constraints) {
    bit_array::operator=(&(this->m_best).x,x);
    dVar1 = duration(this);
    (this->m_best).duration = dVar1;
    (this->m_best).loop = i;
    (this->m_best).remaining_constraints = remaining;
  }
  return;
}

Assistant:

void store_if_better(const bit_array& x, int remaining, long int i)
    {
        if (m_best.remaining_constraints > remaining) {
            m_best.x = x;
            m_best.duration = duration();
            m_best.loop = i;
            m_best.remaining_constraints = remaining;
        }
    }